

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_expression.hpp
# Opt level: O1

value_type __thiscall
jsoncons::jsonpath::
jsonpath_expression<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
::evaluate(jsonpath_expression<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
           *this,const_reference root,result_options options)

{
  static_resources<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *psVar1;
  result_options in_ECX;
  undefined4 in_register_00000014;
  path_node_type *path;
  undefined8 extraout_RDX;
  value_type *result;
  value_type vVar2;
  eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  context;
  eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  local_e8;
  anon_union_16_15_54cbd7ed_for_basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_5
  local_58;
  undefined4 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  
  path = (path_node_type *)CONCAT44(in_register_00000014,options);
  if ((in_ECX & path) == value) {
    detail::
    eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
    ::eval_context(&local_e8,(allocator_type *)root);
    local_58._0_8_ = 0;
    local_58.int64_.val_ = 1;
    local_48 = 0;
    local_40 = 0;
    uStack_38 = 0;
    local_30 = 0;
    detail::
    path_expression<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
    ::evaluate((path_expression<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                *)this,(eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                        *)(root + 1),(reference)&local_e8,path,(reference)&local_58.common_,options)
    ;
  }
  else {
    detail::
    eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
    ::eval_context(&local_e8,(allocator_type *)root);
    psVar1 = (static_resources<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *)operator_new(0x20);
    *(undefined8 *)
     &(psVar1->selectors_).
      super__Vector_base<std::unique_ptr<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>_>_>
      ._M_impl = 0;
    *(pointer *)
     ((long)&(psVar1->selectors_).
             super__Vector_base<std::unique_ptr<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>_>_>
     + 8) = (pointer)0x0;
    *(pointer *)
     ((long)&(psVar1->selectors_).
             super__Vector_base<std::unique_ptr<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>_>_>
     + 0x10) = (pointer)0x0;
    *(undefined2 *)this = 0xe;
    (this->static_resources_)._M_t.
    super___uniq_ptr_impl<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    .
    super__Head_base<0UL,_jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
    ._M_head_impl = psVar1;
    local_58._0_8_ = 0;
    local_58.int64_.val_ = 1;
    local_48 = 0;
    local_40 = 0;
    uStack_38 = 0;
    local_30 = 0;
    detail::
    path_expression<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>
    ::
    evaluate<jsoncons::jsonpath::jsonpath_expression<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>::evaluate(jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::jsonpath::result_options)const::_lambda(jsoncons::jsonpath::basic_path_node<wchar_t>const&,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&)_1_>
              ((path_expression<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>
                *)(root + 1),&local_e8,(reference)path,(path_node_type *)&local_58.common_,
               (reference)path,(anon_class_8_1_6971b95b)this,in_ECX);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_e8.length_label_._M_dataplus._M_p != &local_e8.length_label_.field_2) {
    operator_delete(local_e8.length_label_._M_dataplus._M_p,
                    local_e8.length_label_.field_2._M_allocated_capacity * 4 + 4);
  }
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_unsigned_long,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_e8.cache_._M_h);
  std::
  vector<std::unique_ptr<jsoncons::jsonpath::basic_path_node<wchar_t>,_std::default_delete<jsoncons::jsonpath::basic_path_node<wchar_t>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonpath::basic_path_node<wchar_t>,_std::default_delete<jsoncons::jsonpath::basic_path_node<wchar_t>_>_>_>_>
  ::~vector(&local_e8.temp_node_values_);
  std::
  vector<std::unique_ptr<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_e8.temp_json_values_);
  vVar2.field_0.int64_.val_ = extraout_RDX;
  vVar2.field_0._0_8_ = this;
  return (value_type)vVar2.field_0;
}

Assistant:

value_type evaluate(const_reference root, result_options options = result_options()) const
        {
            if ((options & result_options::path) == result_options::path)
            {
                jsoncons::jsonpath::detail::eval_context<value_type, const_reference> context{ alloc_ };

                value_type result(json_array_arg, semantic_tag::none, alloc_);
                auto callback = [&result](const path_node_type& p, const_reference)
                {
                    result.emplace_back(to_basic_string(p));
                };
                const_expr_.evaluate(context, root, path_node_type{}, root, callback, options);
                return result;
            }
            jsoncons::jsonpath::detail::eval_context<value_type, const_reference> context{ alloc_ };
            return const_expr_.evaluate(context, root, path_node_type{}, root, options);
        }